

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toucs.c
# Opt level: O1

void unicode_emit(void *ctx,long output)

{
  wchar_t *pwVar1;
  int iVar2;
  wchar_t *pwVar3;
  wchar_t outval;
  
  if (output == 0xffff) {
    pwVar1 = *(wchar_t **)((long)ctx + 0x10);
    if (pwVar1 != (wchar_t *)0x0) {
      iVar2 = *(int *)((long)ctx + 0x18);
      goto LAB_00115672;
    }
    outval = L'�';
  }
  else {
    outval = (wchar_t)output;
  }
  pwVar1 = &outval;
  iVar2 = 1;
LAB_00115672:
  if (*(int *)((long)ctx + 8) < iVar2) {
    *(undefined4 *)((long)ctx + 0x1c) = 1;
    return;
  }
  if (0 < iVar2) {
    pwVar3 = *ctx;
    iVar2 = iVar2 + 1;
    do {
      *pwVar3 = *pwVar1;
      *(int *)((long)ctx + 8) = *(int *)((long)ctx + 8) + -1;
      pwVar1 = pwVar1 + 1;
      pwVar3 = pwVar3 + 1;
      iVar2 = iVar2 + -1;
    } while (1 < iVar2);
    *(wchar_t **)ctx = pwVar3;
  }
  return;
}

Assistant:

static void unicode_emit(void *ctx, long int output)
{
    struct unicode_emit_param *param = (struct unicode_emit_param *)ctx;
    wchar_t outval;
    wchar_t const *p;
    int outlen;

    if (output == ERROR) {
        if (param->errstr) {
            p = param->errstr;
            outlen = param->errlen;
        } else {
            outval = 0xFFFD;           /* U+FFFD REPLACEMENT CHARACTER */
            p = &outval;
            outlen = 1;
        }
    } else {
        outval = output;
        p = &outval;
        outlen = 1;
    }

    if (param->outlen >= outlen) {
        while (outlen > 0) {
            *param->output++ = *p++;
            param->outlen--;
            outlen--;
        }
    } else {
        param->stopped = 1;
    }
}